

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md5.c
# Opt level: O2

MD5_context * Curl_MD5_init(MD5_params *md5params)

{
  MD5_context *pMVar1;
  MD5_context *pMVar2;
  MD5_context *pMVar3;
  
  pMVar1 = (MD5_context *)(*Curl_cmalloc)(0x10);
  if (pMVar1 == (MD5_context *)0x0) {
    pMVar3 = (MD5_context *)0x0;
  }
  else {
    pMVar2 = (MD5_context *)(*Curl_cmalloc)((size_t)md5params->md5_ctxtsize);
    pMVar1->md5_hashctx = pMVar2;
    if (pMVar2 == (MD5_context *)0x0) {
      pMVar3 = (MD5_context *)0x0;
      pMVar2 = pMVar1;
      md5params = (MD5_params *)&Curl_cfree;
    }
    else {
      pMVar1->md5_hash = md5params;
      pMVar3 = pMVar1;
    }
    (*md5params->md5_init_func)(pMVar2);
  }
  return pMVar3;
}

Assistant:

MD5_context *Curl_MD5_init(const MD5_params *md5params)
{
  MD5_context *ctxt;

  /* Create MD5 context */
  ctxt = malloc(sizeof(*ctxt));

  if(!ctxt)
    return ctxt;

  ctxt->md5_hashctx = malloc(md5params->md5_ctxtsize);

  if(!ctxt->md5_hashctx) {
    free(ctxt);
    return NULL;
  }

  ctxt->md5_hash = md5params;

  (*md5params->md5_init_func)(ctxt->md5_hashctx);

  return ctxt;
}